

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::GenerateSwiftOutputFileMap
          (cmNinjaTargetGenerator *this,string *config,string *flags)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
  *this_00;
  cmGeneratorTarget *this_01;
  cmLocalNinjaGenerator *pcVar1;
  _Alloc_hider this_02;
  bool bVar2;
  mapped_type *pmVar3;
  cmValue cVar4;
  Value *pVVar5;
  string *psVar6;
  char local_359;
  string local_358;
  string *local_338;
  string mapFilePath;
  string local_308;
  Value deps;
  string targetSwiftDepsPath;
  cmGeneratedFileStream output;
  
  this_00 = &this->Configs;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
           ::operator[](this_00,config);
  bVar2 = Json::Value::empty(&pmVar3->SwiftOutputMap);
  if (!bVar2) {
    local_338 = flags;
    mapFilePath._M_dataplus._M_p = (pointer)this;
    std::__cxx11::string::string((string *)&mapFilePath._M_string_length,(string *)config);
    this_02._M_p = mapFilePath._M_dataplus._M_p;
    this_01 = *(cmGeneratorTarget **)(mapFilePath._M_dataplus._M_p + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"Swift_DEPENDENCIES_FILE",(allocator<char> *)&deps);
    cVar4 = cmGeneratorTarget::GetProperty(this_01,(string *)&output);
    std::__cxx11::string::~string((string *)&output);
    if (cVar4.Value == (string *)0x0) {
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_308,this_01);
      output.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)local_308._M_string_length;
      deps._8_8_ = &deps.comments_;
      deps.value_.int_ = 1;
      deps.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._0_1_ = 0x2f;
      local_359 = '/';
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
      cmStrCat<std::__cxx11::string,char,std::__cxx11::string,char[11]>
                (&local_358,(cmAlphaNum *)&output,(cmAlphaNum *)&deps,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &mapFilePath._M_string_length,&local_359,psVar6,(char (*) [11])".swiftdeps");
      psVar6 = ConvertToNinjaPath((cmNinjaTargetGenerator *)this_02._M_p,&local_358);
      std::__cxx11::string::string((string *)&targetSwiftDepsPath,(string *)psVar6);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_308);
    }
    else {
      std::__cxx11::string::string((string *)&targetSwiftDepsPath,(string *)cVar4.Value);
    }
    std::__cxx11::string::~string((string *)&mapFilePath._M_string_length);
    cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
              (&local_358,(this->super_cmCommonTargetGenerator).GeneratorTarget);
    output.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)local_358._M_string_length;
    output.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         local_358._M_dataplus._M_p;
    deps._8_8_ = &deps.comments_;
    deps.value_.int_ = 1;
    deps.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._0_1_ = 0x2f;
    local_308._M_dataplus._M_p._0_1_ = 0x2f;
    cmStrCat<std::__cxx11::string,char,char[21]>
              (&mapFilePath,(cmAlphaNum *)&output,(cmAlphaNum *)&deps,config,(char *)&local_308,
               (char (*) [21])"output-file-map.json");
    std::__cxx11::string::~string((string *)&local_358);
    Json::Value::Value(&deps,objectValue);
    Json::Value::Value((Value *)&output,&targetSwiftDepsPath);
    pVVar5 = Json::Value::operator[](&deps,"swift-dependencies");
    Json::Value::operator=(pVVar5,(Value *)&output);
    Json::Value::~Value((Value *)&output);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
             ::operator[](this_00,config);
    pVVar5 = Json::Value::operator[](&pmVar3->SwiftOutputMap,"");
    Json::Value::operator=(pVVar5,&deps);
    cmGeneratedFileStream::cmGeneratedFileStream(&output,&mapFilePath,false,None);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
             ::operator[](this_00,config);
    Json::operator<<((OStream *)&output,&pmVar3->SwiftOutputMap);
    pcVar1 = this->LocalGenerator;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"-output-file-map",(allocator<char> *)&local_308);
    (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
              (pcVar1,local_338,&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    pcVar1 = this->LocalGenerator;
    psVar6 = ConvertToNinjaPath(this,&mapFilePath);
    (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[8])
              (pcVar1,local_338,psVar6);
    cmGeneratedFileStream::~cmGeneratedFileStream(&output);
    Json::Value::~Value(&deps);
    std::__cxx11::string::~string((string *)&mapFilePath);
    std::__cxx11::string::~string((string *)&targetSwiftDepsPath);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::GenerateSwiftOutputFileMap(
  const std::string& config, std::string& flags)
{
  if (this->Configs[config].SwiftOutputMap.empty()) {
    return;
  }

  std::string const targetSwiftDepsPath = [this, config]() -> std::string {
    cmGeneratorTarget const* target = this->GeneratorTarget;
    if (cmValue name = target->GetProperty("Swift_DEPENDENCIES_FILE")) {
      return *name;
    }
    return this->ConvertToNinjaPath(cmStrCat(target->GetSupportDirectory(),
                                             '/', config, '/',
                                             target->GetName(), ".swiftdeps"));
  }();

  std::string mapFilePath =
    cmStrCat(this->GeneratorTarget->GetSupportDirectory(), '/', config, '/',
             "output-file-map.json");

  // build the global target dependencies
  // https://github.com/apple/swift/blob/master/docs/Driver.md#output-file-maps
  Json::Value deps(Json::objectValue);
  deps["swift-dependencies"] = targetSwiftDepsPath;
  this->Configs[config].SwiftOutputMap[""] = deps;

  cmGeneratedFileStream output(mapFilePath);
  output << this->Configs[config].SwiftOutputMap;

  // Add flag
  this->LocalGenerator->AppendFlags(flags, "-output-file-map");
  this->LocalGenerator->AppendFlagEscape(flags,
                                         ConvertToNinjaPath(mapFilePath));
}